

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBuilderUtil.cpp
# Opt level: O2

void __thiscall
vk::DescriptorSetUpdateBuilder::update
          (DescriptorSetUpdateBuilder *this,DeviceInterface *vk,VkDevice device)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer *ppHVar3;
  long lVar4;
  VkBufferView **ppVVar5;
  pointer pVVar6;
  bool bVar7;
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> writes;
  
  std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::vector
            (&writes,&this->m_writes);
  pVVar6 = (this->m_writes).
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar1 = (this->m_writes).
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)pVVar6 - (long)pVVar1 >> 6;
  ppVVar5 = &(writes.
              super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
              ._M_impl.super__Vector_impl_data._M_start)->pTexelBufferView;
  ppHVar3 = &(((this->m_writeDescriptorInfos).
               super__Vector_base<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
               ._M_impl.super__Vector_impl_data._M_start)->texelBufferViews).
             super__Vector_base<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
    if ((VkDescriptorImageInfo *)ppHVar3[-7] != (VkDescriptorImageInfo *)ppHVar3[-6]) {
      ppVVar5[-2] = (VkBufferView *)ppHVar3[-7];
    }
    if ((VkDescriptorBufferInfo *)ppHVar3[-4] != (VkDescriptorBufferInfo *)ppHVar3[-3]) {
      ppVVar5[-1] = (VkBufferView *)ppHVar3[-4];
    }
    if (((_Vector_impl_data *)(ppHVar3 + -1))->_M_start != *ppHVar3) {
      *ppVVar5 = ((_Vector_impl_data *)(ppHVar3 + -1))->_M_start;
    }
    ppVVar5 = ppVVar5 + 8;
    ppHVar3 = ppHVar3 + 9;
  }
  pVVar2 = writes.
           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 == pVVar6) {
    pVVar2 = (pointer)0x0;
  }
  pVVar6 = (pointer)(this->m_copies).
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_copies).
                super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6;
  if (lVar4 == 0) {
    pVVar6 = (pointer)0x0;
  }
  (*vk->_vptr_DeviceInterface[0x3e])
            (vk,device,
             (ulong)((long)writes.
                           super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 6 & 0xffffffff,pVVar2,
             lVar4 / 0x38 & 0xffffffff,pVVar6);
  std::_Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
  ~_Vector_base(&writes.
                 super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
               );
  return;
}

Assistant:

void DescriptorSetUpdateBuilder::update (const DeviceInterface& vk, VkDevice device) const
{
	// Update VkWriteDescriptorSet structures with stored info
	std::vector<VkWriteDescriptorSet> writes	= m_writes;

	for (size_t writeNdx = 0; writeNdx < m_writes.size(); writeNdx++)
	{
		const WriteDescriptorInfo& writeInfo = m_writeDescriptorInfos[writeNdx];

		if (!writeInfo.imageInfos.empty())
			writes[writeNdx].pImageInfo			= &writeInfo.imageInfos[0];

		if (!writeInfo.bufferInfos.empty())
			writes[writeNdx].pBufferInfo		= &writeInfo.bufferInfos[0];

		if (!writeInfo.texelBufferViews.empty())
			writes[writeNdx].pTexelBufferView	= &writeInfo.texelBufferViews[0];
	}

	const VkWriteDescriptorSet* const	writePtr	= (m_writes.empty()) ? (DE_NULL) : (&writes[0]);
	const VkCopyDescriptorSet* const	copyPtr		= (m_copies.empty()) ? (DE_NULL) : (&m_copies[0]);

	vk.updateDescriptorSets(device, (deUint32)writes.size(), writePtr, (deUint32)m_copies.size(), copyPtr);
}